

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_xattr.c
# Opt level: O0

void archive_entry_xattr_add_entry(archive_entry *entry,char *name,void *value,size_t size)

{
  ae_xattr *paVar1;
  char *pcVar2;
  void *pvVar3;
  ae_xattr *xp;
  size_t size_local;
  void *value_local;
  char *name_local;
  archive_entry *entry_local;
  
  paVar1 = (ae_xattr *)malloc(0x20);
  if (paVar1 == (ae_xattr *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  pcVar2 = strdup(name);
  paVar1->name = pcVar2;
  if (pcVar2 == (char *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  pvVar3 = malloc(size);
  paVar1->value = pvVar3;
  if (pvVar3 == (void *)0x0) {
    paVar1->size = 0;
  }
  else {
    memcpy(paVar1->value,value,size);
    paVar1->size = size;
  }
  paVar1->next = entry->xattr_head;
  entry->xattr_head = paVar1;
  return;
}

Assistant:

void
archive_entry_xattr_add_entry(struct archive_entry *entry,
	const char *name, const void *value, size_t size)
{
	struct ae_xattr	*xp;

	if ((xp = malloc(sizeof(struct ae_xattr))) == NULL)
		__archive_errx(1, "Out of memory");

	if ((xp->name = strdup(name)) == NULL)
		__archive_errx(1, "Out of memory");

	if ((xp->value = malloc(size)) != NULL) {
		memcpy(xp->value, value, size);
		xp->size = size;
	} else
		xp->size = 0;

	xp->next = entry->xattr_head;
	entry->xattr_head = xp;
}